

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateRight
          (BTreeImpl *this,Leaf *left,Leaf *right,Parent *parent,uint indexInParent)

{
  bool bVar1;
  uint uVar2;
  uint back;
  size_t mid;
  Fault f_1;
  Fault local_38;
  Fault f;
  uint indexInParent_local;
  Parent *parent_local;
  Leaf *right_local;
  Leaf *left_local;
  BTreeImpl *this_local;
  
  f.exception._4_4_ = indexInParent;
  bVar1 = Leaf::isHalfFull(right);
  if (!bVar1) {
    Debug::Fault::Fault(&local_38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2f7,FAILED,"right.isHalfFull()","");
    Debug::Fault::fatal(&local_38);
  }
  bVar1 = Leaf::isMostlyFull(left);
  if (!bVar1) {
    Debug::Fault::Fault((Fault *)&mid,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x2f8,FAILED,"left.isMostlyFull()","");
    Debug::Fault::fatal((Fault *)&mid);
  }
  amove<kj::_::BTreeImpl::MaybeUint>(right->rows + 1,right->rows,7);
  uVar2 = Leaf::size(left);
  right->rows[0].i = left->rows[uVar2 - 1].i;
  parent->keys[f.exception._4_4_].i = left->rows[uVar2 - 2].i;
  MaybeUint::operator=(left->rows + (uVar2 - 1),(void *)0x0);
  return;
}

Assistant:

void BTreeImpl::rotateRight(Leaf& left, Leaf& right, Parent& parent, uint indexInParent) {
  // Steal one item from the left node and move it to the right node.

  // Like mergeFrom(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(right.isHalfFull());
  KJ_DASSERT(left.isMostlyFull());

  constexpr size_t mid = Leaf::NROWS/2;
  amove(right.rows + 1, right.rows, mid);

  uint back = left.size() - 1;

  right.rows[0] = left.rows[back];
  parent.keys[indexInParent] = left.rows[back - 1];
  left.rows[back] = nullptr;
}